

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

void Sbl_ManWindow(Sbl_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_18;
  int local_14;
  int ObjId;
  int i;
  Sbl_Man_t *p_local;
  
  Vec_IntClear(p->vLeaves);
  local_14 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->pGia->vCis);
    bVar4 = false;
    if (local_14 < iVar2) {
      pGVar1 = p->pGia;
      pGVar3 = Gia_ManCi(p->pGia,local_14);
      local_18 = Gia_ObjId(pGVar1,pGVar3);
      bVar4 = local_18 != 0;
    }
    if (!bVar4) break;
    Vec_IntPush(p->vLeaves,local_18);
    local_14 = local_14 + 1;
  }
  Vec_IntClear(p->vAnds);
  for (local_18 = 0; local_18 < p->pGia->nObjs; local_18 = local_18 + 1) {
    pGVar3 = Gia_ManObj(p->pGia,local_18);
    iVar2 = Gia_ObjIsAnd(pGVar3);
    if (iVar2 != 0) {
      Vec_IntPush(p->vAnds,local_18);
    }
  }
  Vec_IntClear(p->vRoots);
  for (local_14 = 0; iVar2 = Vec_IntSize(p->pGia->vCos), local_14 < iVar2; local_14 = local_14 + 1)
  {
    pGVar1 = p->pGia;
    pGVar3 = Gia_ManCo(p->pGia,local_14);
    iVar2 = Gia_ObjFaninId0p(pGVar1,pGVar3);
    Vec_IntPush(p->vRoots,iVar2);
  }
  return;
}

Assistant:

void Sbl_ManWindow( Sbl_Man_t * p )
{
    int i, ObjId;
    // collect leaves
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachCiId( p->pGia, ObjId, i )
        Vec_IntPush( p->vLeaves, ObjId );
    // collect internal
    Vec_IntClear( p->vAnds );
    Gia_ManForEachAndId( p->pGia, ObjId )
        Vec_IntPush( p->vAnds, ObjId );
    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachCoDriverId( p->pGia, ObjId, i )
        Vec_IntPush( p->vRoots, ObjId );
}